

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>::
insert<kj::_::(anonymous_namespace)::SiPair,char_const(&)[6]>
          (HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *this,
          ArrayPtr<kj::_::(anonymous_namespace)::SiPair> table,size_t pos,char (*params) [7])

{
  uint uVar1;
  HashBucket *pHVar2;
  size_t sVar3;
  void *__s1;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar9;
  ulong uVar10;
  uint uVar11;
  size_t sVar12;
  HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *this_00;
  uchar *in_R9;
  HashBucket *_s944;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar13;
  ArrayPtr<const_unsigned_char> s;
  Maybe<unsigned_long> MVar14;
  
  this_00 = (HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *)table.ptr;
  if ((this_00->buckets).size_ * 2 < (this_00->erasedCount + pos) * 3 + 3) {
    rehash(this_00,pos * 3 + 3);
  }
  sVar6 = strlen((char *)in_R9);
  s.size_ = sVar6;
  s.ptr = in_R9;
  uVar4 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
  pHVar2 = (this_00->buckets).ptr;
  sVar3 = (this_00->buckets).size_;
  paVar13 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
  uVar11 = (int)sVar3 - 1U & uVar4;
  do {
    paVar8 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(pHVar2 + uVar11);
    uVar1 = *(uint *)((long)paVar8 + 4);
    if (uVar1 == 1) {
      if (paVar13 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar13 = paVar8;
      }
    }
    else {
      if (uVar1 == 0) {
        if (paVar13 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          paVar8 = paVar13;
        }
        aVar9.value = ((ulong)uVar4 | (long)params << 0x20) + 0x200000000;
        paVar8->value = (unsigned_long)aVar9;
        *(undefined1 *)this = 0;
        goto LAB_00162490;
      }
      if (*(uint *)paVar8 == uVar4) {
        uVar10 = (ulong)(uVar1 - 2);
        __s1 = *(void **)(table.size_ + uVar10 * 0x18);
        sVar6 = *(size_t *)(table.size_ + 8 + uVar10 * 0x18);
        sVar7 = strlen((char *)in_R9);
        if (sVar6 == sVar7 + 1) {
          aVar9 = extraout_RDX;
          if (sVar6 == 0) {
LAB_00162484:
            *(undefined1 *)this = 1;
            this->erasedCount = uVar10;
LAB_00162490:
            MVar14.ptr.field_1.value = aVar9.value;
            MVar14.ptr._0_8_ = this;
            return (Maybe<unsigned_long>)MVar14.ptr;
          }
          iVar5 = bcmp(__s1,in_R9,sVar6);
          aVar9._0_4_ = 0;
          aVar9._4_4_ = 0;
          if (iVar5 == 0) goto LAB_00162484;
        }
      }
    }
    sVar12 = (ulong)uVar11 + 1;
    uVar11 = (uint)sVar12;
    if (sVar12 == sVar3) {
      uVar11 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }